

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Reader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::Code93Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code93Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  Iterator puVar5;
  Iterator puVar6;
  ushort uVar7;
  long lVar8;
  size_type sVar9;
  uint local_144;
  string txt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  Error error;
  string local_d0;
  undefined7 local_b0;
  undefined1 uStack_a9;
  short sStack_a8;
  Type TStack_a6;
  string local_a0;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  char cStack_38;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  FindLeftGuard<6,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)&error,(ZXing *)next,(PatternView *)0x1e,0x15c820,
             (_func_bool_PatternView_ptr_int *)param_3);
  next->_base = (Iterator)
                CONCAT71(error._msg.field_2._M_allocated_capacity._1_7_,
                         error._msg.field_2._M_local_buf[0]);
  next->_end = (Iterator)error._msg.field_2._8_8_;
  next->_data = (Iterator)error._msg._M_dataplus._M_p;
  *(size_type *)&next->_size = error._msg._M_string_length;
  puVar5 = next->_data;
  puVar6 = next->_base;
  if ((puVar5 < puVar6 || puVar5 == (Iterator)0x0) || (next->_end < puVar5 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (puVar6 == puVar5) {
    local_144 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar7 = uVar7 + *puVar6;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar5);
    local_144 = (uint)uVar7;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  do {
    if ((next->_data == (Iterator)0x0) ||
       (puVar5 = next->_data + next->_size, next->_data = puVar5, next->_end < puVar5 + next->_size)
       ) goto LAB_0015c3cd;
    iVar4 = RowReader::OneToFourBitPattern<6,9>(next);
    RowReader::LookupBitPattern<int[48],char[49]>
              (iVar4,(int (*) [48])CHARACTER_ENCODINGS,
               (char (*) [49])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*");
    std::__cxx11::string::push_back((char)&txt);
    if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0015c3cd;
  } while (txt._M_dataplus._M_p[txt._M_string_length - 1] != '*');
  std::__cxx11::string::pop_back();
  sVar9 = txt._M_string_length;
  if (2 < (int)txt._M_string_length) {
    puVar5 = next->_data;
    next->_size = 7;
    puVar1 = puVar5 + 7;
    if (puVar1 <= next->_end && (next->_base <= puVar5 && puVar5 != (Iterator)0x0)) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + *(short *)((long)puVar5 + lVar8);
        lVar8 = lVar8 + 2;
      } while (lVar8 != 0xc);
      if (puVar5[6] <= uVar7 >> 2) {
        if (puVar1 != next->_end + -1) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            uVar7 = uVar7 + *(short *)((long)puVar5 + lVar8);
            lVar8 = lVar8 + 2;
          } while (lVar8 != 0xe);
          if ((float)*puVar1 < (float)uVar7 * 0.5) goto LAB_0015c3cd;
        }
        error._msg._M_dataplus._M_p = (pointer)&error._msg.field_2;
        error._msg._M_string_length = 0;
        error._msg.field_2._M_local_buf[0] = '\0';
        error._file._0_7_ = 0;
        error._file._7_1_ = 0;
        error._line = -1;
        error._type = None;
        bVar3 = CheckChecksums((OneD *)txt._M_dataplus._M_p,(string *)txt._M_string_length);
        if (!bVar3) {
          local_d0.field_2._M_local_buf[0] = '\0';
          local_d0.field_2._M_allocated_capacity._1_7_ = uStack_3f;
          local_d0.field_2._M_local_buf[8] = cStack_38;
          local_d0.field_2._9_4_ = local_37;
          local_d0.field_2._13_2_ = local_33;
          local_d0.field_2._M_local_buf[0xf] = local_31;
          local_d0._M_string_length = 0;
          local_48 = 0;
          local_40 = 0;
          local_b0 = 0x1968bd;
          uStack_a9 = 0;
          sStack_a8 = 0x77;
          TStack_a6 = Checksum;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_50 = &local_40;
          std::__cxx11::string::operator=((string *)&error,(string *)&local_d0);
          error._line = sStack_a8;
          error._type = TStack_a6;
          error._file._0_7_ = local_b0;
          error._file._7_1_ = uStack_a9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          sVar9 = txt._M_string_length;
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
            sVar9 = txt._M_string_length;
          }
        }
        std::__cxx11::string::resize((ulong)&txt,(char)sVar9 + -2);
        if (error._type == None) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,txt._M_dataplus._M_p,
                     txt._M_dataplus._M_p + txt._M_string_length);
          DecodeCode39AndCode93FullASCII(&local_d0,&local_a0,"abcd");
          lVar8 = std::__cxx11::string::operator=((string *)&txt,(string *)&local_d0);
          lVar8 = *(long *)(lVar8 + 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (lVar8 == 0) {
            local_120 = &local_110;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,"ASCII decoding of Code93 failed","");
            if (local_120 == &local_110) {
              local_d0.field_2._M_local_buf[8] = (char)local_110._8_8_;
              local_d0.field_2._9_4_ = (undefined4)((ulong)local_110._8_8_ >> 8);
              local_d0.field_2._13_2_ = (undefined2)((ulong)local_110._8_8_ >> 0x28);
              local_d0.field_2._M_local_buf[0xf] = (char)((ulong)local_110._8_8_ >> 0x38);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)local_120;
            }
            local_d0.field_2._M_allocated_capacity._1_7_ = local_110._M_allocated_capacity._1_7_;
            local_d0.field_2._M_local_buf[0] = local_110._M_local_buf[0];
            local_d0._M_string_length = local_118;
            local_120 = &local_110;
            local_118 = 0;
            local_110._M_local_buf[0] = '\0';
            local_b0 = 0x1968bd;
            uStack_a9 = 0;
            sStack_a8 = 0x7d;
            TStack_a6 = Format;
            std::__cxx11::string::operator=((string *)&error,(string *)&local_d0);
            error._line = sStack_a8;
            error._type = TStack_a6;
            error._file._0_7_ = local_b0;
            error._file._7_1_ = uStack_a9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,
                              CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                       local_d0.field_2._M_local_buf[0]) + 1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,
                              CONCAT71(local_110._M_allocated_capacity._1_7_,
                                       local_110._M_local_buf[0]) + 1);
            }
          }
        }
        puVar5 = next->_base;
        if (puVar5 == next->_data + next->_size) {
          iVar4 = -1;
        }
        else {
          uVar7 = 0;
          do {
            uVar7 = uVar7 + *puVar5;
            puVar5 = puVar5 + 1;
          } while (puVar5 != next->_data + next->_size);
          iVar4 = uVar7 - 1;
        }
        paVar2 = &local_80._msg.field_2;
        local_80._msg._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,error._msg._M_dataplus._M_p,
                   error._msg._M_dataplus._M_p + error._msg._M_string_length);
        local_80._file._0_7_ = error._file._0_7_;
        local_80._40_3_ =
             SUB43(CONCAT13(error._type,CONCAT21(error._line,error._file._7_1_)) >> 8,0);
        local_80._file._7_1_ = error._file._7_1_;
        Result::Result(__return_storage_ptr__,&txt,rowNumber,local_144,iVar4,Code93,
                       (SymbologyIdentifier)0x3047,&local_80,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._msg._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._msg._M_dataplus._M_p,
                          local_80._msg.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error._msg._M_dataplus._M_p != &error._msg.field_2) {
          operator_delete(error._msg._M_dataplus._M_p,
                          CONCAT71(error._msg.field_2._M_allocated_capacity._1_7_,
                                   error._msg.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0015c3e4;
      }
    }
  }
LAB_0015c3cd:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0015c3e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p != &txt.field_2) {
    operator_delete(txt._M_dataplus._M_p,
                    CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) +
                    1);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Code93Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop, checksum and 1 payload characters)
	int minCharCount = 5;

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsStartGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width
		if (!next.skipSymbol())
			return {};

		txt += LookupBitPattern(OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(next), CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (txt.back() != '*');

	txt.pop_back(); // remove asterisk

	if (Size(txt) < minCharCount - 2)
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	Error error;
	if (!CheckChecksums(txt))
		error = ChecksumError();

	// Remove checksum digits
	txt.resize(txt.size() - 2);

	if (!error && (txt = DecodeCode39AndCode93FullASCII(txt, "abcd")).empty())
		error = FormatError("ASCII decoding of Code93 failed");

	// Symbology identifier ISO/IEC 15424:2008 4.4.10 no modifiers
	SymbologyIdentifier symbologyIdentifier = {'G', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Code93, symbologyIdentifier, error);
}